

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetwork *nn)

{
  int iVar1;
  uint32 uVar2;
  Rep *pRVar3;
  NeuralNetworkLayer *layer;
  Tensor *pTVar4;
  pointer pcVar5;
  key_type *pkVar6;
  _Base_ptr p_Var7;
  string *psVar8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  Type *pTVar12;
  iterator iVar13;
  uint32 *puVar14;
  undefined8 *puVar15;
  long *plVar16;
  iterator iVar17;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  mapped_type *pmVar18;
  size_type *psVar19;
  ulong *puVar20;
  long lVar21;
  void **ppvVar22;
  ulong uVar23;
  string err_7;
  string err;
  Result r;
  int local_1f4;
  string local_1f0;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [24];
  Result *local_188;
  RepeatedPtrFieldBase *local_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  long *local_158;
  undefined8 local_150;
  long local_148;
  undefined8 uStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  size_type *local_f8;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_b8;
  void **local_b0;
  NeuralNetworkSpecValidator *local_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  long *local_68 [2];
  long local_58 [2];
  RepeatedPtrFieldBase *local_48;
  void **local_40;
  void **local_38;
  
  local_188 = __return_storage_ptr__;
  local_a8 = this;
  Result::Result((Result *)&local_f8);
  pRVar3 = (nn->layers_).super_RepeatedPtrFieldBase.rep_;
  ppvVar22 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar22 = (void **)0x0;
  }
  lVar11 = (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar11 != 0) {
    local_40 = ppvVar22 + lVar11;
    local_c0 = &(local_188->m_message).field_2;
    local_c8 = &local_a8->ModelIOBlobNameToRank;
    local_78 = &(local_a8->ModelIOBlobNameToRank)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d0 = &local_a8->blobNameToRank;
    local_80 = &(local_a8->blobNameToRank)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b8 = &local_a8->blobs;
    local_70 = &(local_a8->blobs)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      layer = (NeuralNetworkLayer *)*ppvVar22;
      bVar9 = Result::good((Result *)&local_f8);
      local_38 = ppvVar22;
      if (bVar9) {
        if (local_a8->ndArrayInterpretation == true) {
          iVar1 = (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
          if (iVar1 == 0) {
LAB_002925ee:
            iVar1 = (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
            if (iVar1 != 0) {
              if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ != iVar1) {
                psVar8 = (layer->name_).ptr_;
                local_1d0 = &local_1c0;
                pcVar5 = (psVar8->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1d0,pcVar5,pcVar5 + psVar8->_M_string_length);
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x328d97);
                local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                psVar19 = puVar15 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar15 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar19) {
                  local_1f0.field_2._M_allocated_capacity = *psVar19;
                  local_1f0.field_2._8_8_ = puVar15[3];
                }
                else {
                  local_1f0.field_2._M_allocated_capacity = *psVar19;
                  local_1f0._M_dataplus._M_p = (pointer)*puVar15;
                }
                local_1f0._M_string_length = puVar15[1];
                *puVar15 = psVar19;
                puVar15[1] = 0;
                *(undefined1 *)(puVar15 + 2) = 0;
                plVar16 = (long *)std::__cxx11::string::append((char *)&local_1f0);
                local_1b0 = (undefined1  [8])local_1a0;
                psVar19 = (size_type *)(plVar16 + 2);
                if ((size_type *)*plVar16 == psVar19) {
                  local_1a0._0_8_ = *psVar19;
                  local_1a0._8_8_ = plVar16[3];
                }
                else {
                  local_1a0._0_8_ = *psVar19;
                  local_1b0 = (undefined1  [8])*plVar16;
                }
                local_1a8._M_p = (pointer)plVar16[1];
                *plVar16 = (long)psVar19;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p,
                                  local_1f0.field_2._M_allocated_capacity + 1);
                }
                if (local_1d0 != &local_1c0) {
                  operator_delete(local_1d0,local_1c0 + 1);
                }
                Result::Result(local_188,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
                goto LAB_002937ae;
              }
              pRVar3 = (layer->outputtensor_).super_RepeatedPtrFieldBase.rep_;
              local_b0 = pRVar3->elements;
              if (pRVar3 == (Rep *)0x0) {
                local_b0 = (void **)0x0;
              }
              lVar11 = (long)(layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
              bVar9 = lVar11 == 0;
              if (!bVar9) {
                local_180 = &(layer->output_).super_RepeatedPtrFieldBase;
                local_48 = &(layer->input_).super_RepeatedPtrFieldBase;
                lVar21 = 0;
                local_1f4 = 0;
                do {
                  pTVar4 = *(Tensor **)((long)local_b0 + lVar21);
                  validateTensorMessage((Result *)local_1b0,pTVar4,layer);
                  local_f8 = (size_type *)local_1b0;
                  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_1a8);
                  if (local_1a8._M_p != local_1a0 + 8) {
                    operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
                  }
                  bVar10 = Result::good((Result *)&local_f8);
                  if (bVar10) {
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1f4);
                    iVar13 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::find(&local_c8->_M_t,pTVar12);
                    if (iVar13._M_node != local_78) {
                      uVar2 = pTVar4->rank_;
                      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                          (local_180,local_1f4);
                      puVar14 = (uint32 *)
                                std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[](local_c8,pTVar12);
                      if (uVar2 == *puVar14) goto LAB_0029270e;
                      psVar8 = (layer->name_).ptr_;
                      local_138 = &local_128;
                      pcVar5 = (psVar8->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_138,pcVar5,pcVar5 + psVar8->_M_string_length);
                      puVar15 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_138,0,(char *)0x0,0x328d97);
                      local_158 = &local_148;
                      plVar16 = puVar15 + 2;
                      if ((long *)*puVar15 == plVar16) {
                        local_148 = *plVar16;
                        uStack_140 = puVar15[3];
                      }
                      else {
                        local_148 = *plVar16;
                        local_158 = (long *)*puVar15;
                      }
                      local_150 = puVar15[1];
                      *puVar15 = plVar16;
                      puVar15[1] = 0;
                      *(undefined1 *)(puVar15 + 2) = 0;
                      plVar16 = (long *)std::__cxx11::string::append((char *)&local_158);
                      local_178 = &local_168;
                      puVar20 = (ulong *)(plVar16 + 2);
                      if ((ulong *)*plVar16 == puVar20) {
                        local_168 = *puVar20;
                        lStack_160 = plVar16[3];
                      }
                      else {
                        local_168 = *puVar20;
                        local_178 = (ulong *)*plVar16;
                      }
                      local_170 = plVar16[1];
                      *plVar16 = (long)puVar20;
                      plVar16[1] = 0;
                      *(undefined1 *)(plVar16 + 2) = 0;
                      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                          (local_48,local_1f4);
                      local_118 = &local_108;
                      pcVar5 = (pTVar12->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_118,pcVar5,pcVar5 + pTVar12->_M_string_length);
                      uVar23 = 0xf;
                      if (local_178 != &local_168) {
                        uVar23 = local_168;
                      }
                      if (uVar23 < (ulong)(local_110 + local_170)) {
                        uVar23 = 0xf;
                        if (local_118 != &local_108) {
                          uVar23 = local_108;
                        }
                        if (uVar23 < (ulong)(local_110 + local_170)) goto LAB_00292a21;
                        puVar15 = (undefined8 *)
                                  std::__cxx11::string::replace
                                            ((ulong)&local_118,0,(char *)0x0,(ulong)local_178);
                      }
                      else {
LAB_00292a21:
                        puVar15 = (undefined8 *)
                                  std::__cxx11::string::_M_append
                                            ((char *)&local_178,(ulong)local_118);
                      }
                      local_1d0 = &local_1c0;
                      puVar20 = puVar15 + 2;
                      if ((ulong *)*puVar15 == puVar20) {
                        local_1c0 = *puVar20;
                        uStack_1b8 = puVar15[3];
                      }
                      else {
                        local_1c0 = *puVar20;
                        local_1d0 = (ulong *)*puVar15;
                      }
                      local_1c8 = puVar15[1];
                      *puVar15 = puVar20;
                      puVar15[1] = 0;
                      *(undefined1 *)puVar20 = 0;
                      puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
                      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                      psVar19 = puVar15 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar15 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar19) {
                        local_1f0.field_2._M_allocated_capacity = *psVar19;
                        local_1f0.field_2._8_8_ = puVar15[3];
                      }
                      else {
                        local_1f0.field_2._M_allocated_capacity = *psVar19;
                        local_1f0._M_dataplus._M_p = (pointer)*puVar15;
                      }
                      local_1f0._M_string_length = puVar15[1];
                      *puVar15 = psVar19;
                      puVar15[1] = 0;
                      *(undefined1 *)(puVar15 + 2) = 0;
                      plVar16 = (long *)std::__cxx11::string::append((char *)&local_1f0);
                      local_1b0 = (undefined1  [8])local_1a0;
                      psVar19 = (size_type *)(plVar16 + 2);
                      if ((size_type *)*plVar16 == psVar19) {
                        local_1a0._0_8_ = *psVar19;
                        local_1a0._8_8_ = plVar16[3];
                      }
                      else {
                        local_1a0._0_8_ = *psVar19;
                        local_1b0 = (undefined1  [8])*plVar16;
                      }
                      local_1a8._M_p = (pointer)plVar16[1];
                      *plVar16 = (long)psVar19;
                      plVar16[1] = 0;
                      *(undefined1 *)(plVar16 + 2) = 0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                        operator_delete(local_1f0._M_dataplus._M_p,
                                        local_1f0.field_2._M_allocated_capacity + 1);
                      }
                      if (local_1d0 != &local_1c0) {
                        operator_delete(local_1d0,local_1c0 + 1);
                      }
                      if (local_118 != &local_108) {
                        operator_delete(local_118,local_108 + 1);
                      }
                      if (local_178 != &local_168) {
                        operator_delete(local_178,local_168 + 1);
                      }
                      if (local_158 != &local_148) {
                        operator_delete(local_158,local_148 + 1);
                      }
                      if (local_138 != &local_128) {
                        operator_delete(local_138,local_128 + 1);
                      }
                      Result::Result(local_188,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
LAB_00292ce8:
                      if (local_1b0 != (undefined1  [8])local_1a0) {
                        operator_delete((void *)local_1b0,local_1a0._0_8_ + 1);
                      }
                      goto LAB_00292d04;
                    }
LAB_0029270e:
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1f4);
                    iVar13 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::find(&local_d0->_M_t,pTVar12);
                    if (iVar13._M_node == local_80) {
                      uVar2 = pTVar4->rank_;
                      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                          (local_180,local_1f4);
                      puVar14 = (uint32 *)
                                std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[](local_d0,pTVar12);
                      *puVar14 = uVar2;
                    }
                    else {
                      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                          (local_180,local_1f4);
                      puVar14 = (uint32 *)
                                std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[](local_d0,pTVar12);
                      if (*puVar14 != pTVar4->rank_) {
                        pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                            (local_180,local_1f4);
                        local_1d0 = &local_1c0;
                        pcVar5 = (pTVar12->_M_dataplus)._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_1d0,pcVar5,pcVar5 + pTVar12->_M_string_length);
                        puVar15 = (undefined8 *)
                                  std::__cxx11::string::replace
                                            ((ulong)&local_1d0,0,(char *)0x0,0x322978);
                        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                        psVar19 = puVar15 + 2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar15 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar19) {
                          local_1f0.field_2._M_allocated_capacity = *psVar19;
                          local_1f0.field_2._8_8_ = puVar15[3];
                        }
                        else {
                          local_1f0.field_2._M_allocated_capacity = *psVar19;
                          local_1f0._M_dataplus._M_p = (pointer)*puVar15;
                        }
                        local_1f0._M_string_length = puVar15[1];
                        *puVar15 = psVar19;
                        puVar15[1] = 0;
                        *(undefined1 *)(puVar15 + 2) = 0;
                        plVar16 = (long *)std::__cxx11::string::append((char *)&local_1f0);
                        local_1b0 = (undefined1  [8])local_1a0;
                        psVar19 = (size_type *)(plVar16 + 2);
                        if ((size_type *)*plVar16 == psVar19) {
                          local_1a0._0_8_ = *psVar19;
                          local_1a0._8_8_ = plVar16[3];
                        }
                        else {
                          local_1a0._0_8_ = *psVar19;
                          local_1b0 = (undefined1  [8])*plVar16;
                        }
                        local_1a8._M_p = (pointer)plVar16[1];
                        *plVar16 = (long)psVar19;
                        plVar16[1] = 0;
                        *(undefined1 *)(plVar16 + 2) = 0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                          operator_delete(local_1f0._M_dataplus._M_p,
                                          local_1f0.field_2._M_allocated_capacity + 1);
                        }
                        if (local_1d0 != &local_1c0) {
                          operator_delete(local_1d0,local_1c0 + 1);
                        }
                        Result::Result(local_188,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
                        goto LAB_00292ce8;
                      }
                    }
                    local_1f4 = local_1f4 + 1;
                    bVar10 = true;
                  }
                  else {
                    *(size_type **)local_188 = local_f8;
                    (local_188->m_message)._M_dataplus._M_p = (pointer)local_c0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_p == &local_e0) {
                      local_c0->_M_allocated_capacity =
                           CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
                      *(undefined8 *)((long)local_c0 + 8) = local_e0._8_8_;
                    }
                    else {
                      (local_188->m_message)._M_dataplus._M_p = local_f0._M_p;
                      (local_188->m_message).field_2._M_allocated_capacity =
                           CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
                    }
                    (local_188->m_message)._M_string_length = local_e8;
                    local_e8 = 0;
                    local_e0._M_local_buf[0] = '\0';
                    local_f0._M_p = (pointer)&local_e0;
LAB_00292d04:
                    bVar10 = false;
                  }
                  if (!bVar10) {
                    bVar10 = true;
                    goto LAB_00292e57;
                  }
                  lVar21 = lVar21 + 8;
                  bVar9 = lVar11 * 8 == lVar21;
                } while (!bVar9);
              }
              bVar10 = false;
LAB_00292e57:
              if (!bVar9) goto LAB_00293001;
            }
            goto LAB_00292e61;
          }
          if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == iVar1) {
            pRVar3 = (layer->inputtensor_).super_RepeatedPtrFieldBase.rep_;
            local_b0 = pRVar3->elements;
            if (pRVar3 == (Rep *)0x0) {
              local_b0 = (void **)0x0;
            }
            lVar11 = (long)(layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
            bVar9 = lVar11 == 0;
            if (!bVar9) {
              local_180 = &(layer->input_).super_RepeatedPtrFieldBase;
              lVar21 = 0;
              local_1f4 = 0;
              do {
                pTVar4 = *(Tensor **)((long)local_b0 + lVar21);
                validateTensorMessage((Result *)local_1b0,pTVar4,layer);
                local_f8 = (size_type *)local_1b0;
                std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_1a8);
                if (local_1a8._M_p != local_1a0 + 8) {
                  operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
                }
                bVar10 = Result::good((Result *)&local_f8);
                if (bVar10) {
                  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                      (local_180,local_1f4);
                  iVar13 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::find(&local_c8->_M_t,pTVar12);
                  if (iVar13._M_node != local_78) {
                    uVar2 = pTVar4->rank_;
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1f4);
                    puVar14 = (uint32 *)
                              std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](local_c8,pTVar12);
                    if (uVar2 == *puVar14) goto LAB_00291e9e;
                    psVar8 = (layer->name_).ptr_;
                    local_138 = &local_128;
                    pcVar5 = (psVar8->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_138,pcVar5,pcVar5 + psVar8->_M_string_length);
                    puVar15 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_138,0,(char *)0x0,0x328d97);
                    local_158 = &local_148;
                    plVar16 = puVar15 + 2;
                    if ((long *)*puVar15 == plVar16) {
                      local_148 = *plVar16;
                      uStack_140 = puVar15[3];
                    }
                    else {
                      local_148 = *plVar16;
                      local_158 = (long *)*puVar15;
                    }
                    local_150 = puVar15[1];
                    *puVar15 = plVar16;
                    puVar15[1] = 0;
                    *(undefined1 *)(puVar15 + 2) = 0;
                    plVar16 = (long *)std::__cxx11::string::append((char *)&local_158);
                    local_178 = &local_168;
                    puVar20 = (ulong *)(plVar16 + 2);
                    if ((ulong *)*plVar16 == puVar20) {
                      local_168 = *puVar20;
                      lStack_160 = plVar16[3];
                    }
                    else {
                      local_168 = *puVar20;
                      local_178 = (ulong *)*plVar16;
                    }
                    local_170 = plVar16[1];
                    *plVar16 = (long)puVar20;
                    plVar16[1] = 0;
                    *(undefined1 *)(plVar16 + 2) = 0;
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1f4);
                    local_118 = &local_108;
                    pcVar5 = (pTVar12->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_118,pcVar5,pcVar5 + pTVar12->_M_string_length);
                    uVar23 = 0xf;
                    if (local_178 != &local_168) {
                      uVar23 = local_168;
                    }
                    if (uVar23 < (ulong)(local_110 + local_170)) {
                      uVar23 = 0xf;
                      if (local_118 != &local_108) {
                        uVar23 = local_108;
                      }
                      if (uVar23 < (ulong)(local_110 + local_170)) goto LAB_002921ae;
                      puVar15 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_118,0,(char *)0x0,(ulong)local_178);
                    }
                    else {
LAB_002921ae:
                      puVar15 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_118)
                      ;
                    }
                    local_1d0 = &local_1c0;
                    puVar20 = puVar15 + 2;
                    if ((ulong *)*puVar15 == puVar20) {
                      local_1c0 = *puVar20;
                      uStack_1b8 = puVar15[3];
                    }
                    else {
                      local_1c0 = *puVar20;
                      local_1d0 = (ulong *)*puVar15;
                    }
                    local_1c8 = puVar15[1];
                    *puVar15 = puVar20;
                    puVar15[1] = 0;
                    *(undefined1 *)puVar20 = 0;
                    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
                    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                    psVar19 = puVar15 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar15 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar19) {
                      local_1f0.field_2._M_allocated_capacity = *psVar19;
                      local_1f0.field_2._8_8_ = puVar15[3];
                    }
                    else {
                      local_1f0.field_2._M_allocated_capacity = *psVar19;
                      local_1f0._M_dataplus._M_p = (pointer)*puVar15;
                    }
                    local_1f0._M_string_length = puVar15[1];
                    *puVar15 = psVar19;
                    puVar15[1] = 0;
                    *(undefined1 *)(puVar15 + 2) = 0;
                    plVar16 = (long *)std::__cxx11::string::append((char *)&local_1f0);
                    local_1b0 = (undefined1  [8])local_1a0;
                    psVar19 = (size_type *)(plVar16 + 2);
                    if ((size_type *)*plVar16 == psVar19) {
                      local_1a0._0_8_ = *psVar19;
                      local_1a0._8_8_ = plVar16[3];
                    }
                    else {
                      local_1a0._0_8_ = *psVar19;
                      local_1b0 = (undefined1  [8])*plVar16;
                    }
                    local_1a8._M_p = (pointer)plVar16[1];
                    *plVar16 = (long)psVar19;
                    plVar16[1] = 0;
                    *(undefined1 *)(plVar16 + 2) = 0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                      operator_delete(local_1f0._M_dataplus._M_p,
                                      local_1f0.field_2._M_allocated_capacity + 1);
                    }
                    if (local_1d0 != &local_1c0) {
                      operator_delete(local_1d0,local_1c0 + 1);
                    }
                    if (local_118 != &local_108) {
                      operator_delete(local_118,local_108 + 1);
                    }
                    if (local_178 != &local_168) {
                      operator_delete(local_178,local_168 + 1);
                    }
                    if (local_158 != &local_148) {
                      operator_delete(local_158,local_148 + 1);
                    }
                    if (local_138 != &local_128) {
                      operator_delete(local_138,local_128 + 1);
                    }
                    Result::Result(local_188,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
LAB_00292475:
                    if (local_1b0 != (undefined1  [8])local_1a0) {
                      operator_delete((void *)local_1b0,local_1a0._0_8_ + 1);
                    }
                    goto LAB_00292491;
                  }
LAB_00291e9e:
                  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                      (local_180,local_1f4);
                  iVar13 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::find(&local_d0->_M_t,pTVar12);
                  if (iVar13._M_node == local_80) {
                    uVar2 = pTVar4->rank_;
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1f4);
                    puVar14 = (uint32 *)
                              std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](local_d0,pTVar12);
                    *puVar14 = uVar2;
                  }
                  else {
                    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                        (local_180,local_1f4);
                    puVar14 = (uint32 *)
                              std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](local_d0,pTVar12);
                    if (*puVar14 != pTVar4->rank_) {
                      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                          (local_180,local_1f4);
                      local_1d0 = &local_1c0;
                      pcVar5 = (pTVar12->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_1d0,pcVar5,pcVar5 + pTVar12->_M_string_length);
                      puVar15 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_1d0,0,(char *)0x0,0x322978);
                      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                      psVar19 = puVar15 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar15 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar19) {
                        local_1f0.field_2._M_allocated_capacity = *psVar19;
                        local_1f0.field_2._8_8_ = puVar15[3];
                      }
                      else {
                        local_1f0.field_2._M_allocated_capacity = *psVar19;
                        local_1f0._M_dataplus._M_p = (pointer)*puVar15;
                      }
                      local_1f0._M_string_length = puVar15[1];
                      *puVar15 = psVar19;
                      puVar15[1] = 0;
                      *(undefined1 *)(puVar15 + 2) = 0;
                      plVar16 = (long *)std::__cxx11::string::append((char *)&local_1f0);
                      local_1b0 = (undefined1  [8])local_1a0;
                      psVar19 = (size_type *)(plVar16 + 2);
                      if ((size_type *)*plVar16 == psVar19) {
                        local_1a0._0_8_ = *psVar19;
                        local_1a0._8_8_ = plVar16[3];
                      }
                      else {
                        local_1a0._0_8_ = *psVar19;
                        local_1b0 = (undefined1  [8])*plVar16;
                      }
                      local_1a8._M_p = (pointer)plVar16[1];
                      *plVar16 = (long)psVar19;
                      plVar16[1] = 0;
                      *(undefined1 *)(plVar16 + 2) = 0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                        operator_delete(local_1f0._M_dataplus._M_p,
                                        local_1f0.field_2._M_allocated_capacity + 1);
                      }
                      if (local_1d0 != &local_1c0) {
                        operator_delete(local_1d0,local_1c0 + 1);
                      }
                      Result::Result(local_188,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
                      goto LAB_00292475;
                    }
                  }
                  local_1f4 = local_1f4 + 1;
                  bVar10 = true;
                }
                else {
                  *(size_type **)local_188 = local_f8;
                  (local_188->m_message)._M_dataplus._M_p = (pointer)local_c0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_p == &local_e0) {
                    local_c0->_M_allocated_capacity =
                         CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
                    *(undefined8 *)((long)local_c0 + 8) = local_e0._8_8_;
                  }
                  else {
                    (local_188->m_message)._M_dataplus._M_p = local_f0._M_p;
                    (local_188->m_message).field_2._M_allocated_capacity =
                         CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
                  }
                  (local_188->m_message)._M_string_length = local_e8;
                  local_e8 = 0;
                  local_e0._M_local_buf[0] = '\0';
                  local_f0._M_p = (pointer)&local_e0;
LAB_00292491:
                  bVar10 = false;
                }
                if (!bVar10) {
                  bVar10 = true;
                  goto LAB_002925e4;
                }
                lVar21 = lVar21 + 8;
                bVar9 = lVar11 * 8 == lVar21;
              } while (!bVar9);
            }
            bVar10 = false;
LAB_002925e4:
            if (bVar9) goto LAB_002925ee;
            goto LAB_00293001;
          }
          psVar8 = (layer->name_).ptr_;
          local_1d0 = &local_1c0;
          pcVar5 = (psVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,pcVar5,pcVar5 + psVar8->_M_string_length);
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x328d97);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          psVar19 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_1f0.field_2._M_allocated_capacity = *psVar19;
            local_1f0.field_2._8_8_ = puVar15[3];
          }
          else {
            local_1f0.field_2._M_allocated_capacity = *psVar19;
            local_1f0._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_1f0._M_string_length = puVar15[1];
          *puVar15 = psVar19;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_1f0);
          local_1b0 = (undefined1  [8])local_1a0;
          psVar19 = (size_type *)(plVar16 + 2);
          if ((size_type *)*plVar16 == psVar19) {
            local_1a0._0_8_ = *psVar19;
            local_1a0._8_8_ = plVar16[3];
          }
          else {
            local_1a0._0_8_ = *psVar19;
            local_1b0 = (undefined1  [8])*plVar16;
          }
          local_1a8._M_p = (pointer)plVar16[1];
          *plVar16 = (long)psVar19;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0,local_1c0 + 1);
          }
          Result::Result(local_188,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
LAB_002937ae:
          if (local_1b0 != (undefined1  [8])local_1a0) {
            operator_delete((void *)local_1b0,local_1a0._0_8_ + 1);
          }
          goto LAB_00292ffc;
        }
LAB_00292e61:
        validateLayer((Result *)local_1b0,local_a8,layer);
        local_f8 = (size_type *)local_1b0;
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_1a8);
        if (local_1a8._M_p != local_1a0 + 8) {
          operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
        }
        bVar9 = Result::good((Result *)&local_f8);
        if (!bVar9) goto LAB_00292f8b;
        pRVar3 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
        ppvVar22 = pRVar3->elements;
        if (pRVar3 == (Rep *)0x0) {
          ppvVar22 = (void **)0x0;
        }
        lVar11 = (long)(layer->input_).super_RepeatedPtrFieldBase.current_size_;
        if (lVar11 != 0) {
          lVar21 = 0;
          do {
            pkVar6 = *(key_type **)((long)ppvVar22 + lVar21);
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::find(&local_b8->_M_t,pkVar6);
            if (iVar17._M_node == local_70) {
              psVar8 = (layer->name_).ptr_;
              local_158 = &local_148;
              pcVar5 = (psVar8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_158,pcVar5,pcVar5 + psVar8->_M_string_length);
              plVar16 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_158,0,(char *)0x0,0x328d97);
              local_178 = &local_168;
              puVar20 = (ulong *)(plVar16 + 2);
              if ((ulong *)*plVar16 == puVar20) {
                local_168 = *puVar20;
                lStack_160 = plVar16[3];
              }
              else {
                local_168 = *puVar20;
                local_178 = (ulong *)*plVar16;
              }
              local_170 = plVar16[1];
              *plVar16 = (long)puVar20;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
              local_1d0 = &local_1c0;
              puVar20 = puVar15 + 2;
              if ((ulong *)*puVar15 == puVar20) {
                local_1c0 = *puVar20;
                uStack_1b8 = puVar15[3];
              }
              else {
                local_1c0 = *puVar20;
                local_1d0 = (ulong *)*puVar15;
              }
              local_1c8 = puVar15[1];
              *puVar15 = puVar20;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              local_138 = &local_128;
              pcVar5 = (pkVar6->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_138,pcVar5,pcVar5 + pkVar6->_M_string_length);
              uVar23 = 0xf;
              if (local_1d0 != &local_1c0) {
                uVar23 = local_1c0;
              }
              if (uVar23 < (ulong)(local_130 + local_1c8)) {
                uVar23 = 0xf;
                if (local_138 != &local_128) {
                  uVar23 = local_128;
                }
                if (uVar23 < (ulong)(local_130 + local_1c8)) goto LAB_00293254;
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_138,0,(char *)0x0,(ulong)local_1d0);
              }
              else {
LAB_00293254:
                puVar15 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_138);
              }
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              psVar19 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar19) {
                local_1f0.field_2._M_allocated_capacity = *psVar19;
                local_1f0.field_2._8_8_ = puVar15[3];
              }
              else {
                local_1f0.field_2._M_allocated_capacity = *psVar19;
                local_1f0._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_1f0._M_string_length = puVar15[1];
              *puVar15 = psVar19;
              puVar15[1] = 0;
              *(undefined1 *)psVar19 = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_1f0);
              local_1b0 = (undefined1  [8])local_1a0;
              psVar19 = (size_type *)(plVar16 + 2);
              if ((size_type *)*plVar16 == psVar19) {
                local_1a0._0_8_ = *psVar19;
                local_1a0._8_8_ = plVar16[3];
              }
              else {
                local_1a0._0_8_ = *psVar19;
                local_1b0 = (undefined1  [8])*plVar16;
              }
              local_1a8._M_p = (pointer)plVar16[1];
              *plVar16 = (long)psVar19;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              if (local_138 != &local_128) {
                operator_delete(local_138,local_128 + 1);
              }
              if (local_1d0 != &local_1c0) {
                operator_delete(local_1d0,local_1c0 + 1);
              }
              if (local_178 != &local_168) {
                operator_delete(local_178,local_168 + 1);
              }
              if (local_158 != &local_148) {
                operator_delete(local_158,local_148 + 1);
              }
              Result::Result(local_188,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
              goto LAB_002937ae;
            }
            lVar21 = lVar21 + 8;
          } while (lVar11 * 8 != lVar21);
        }
        pRVar3 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
        ppvVar22 = pRVar3->elements;
        if (pRVar3 == (Rep *)0x0) {
          ppvVar22 = (void **)0x0;
        }
        lVar11 = (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_;
        bVar10 = false;
        if (lVar11 != 0) {
          lVar21 = 0;
          do {
            pkVar6 = *(key_type **)((long)ppvVar22 + lVar21);
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::find(&local_b8->_M_t,pkVar6);
            if ((iVar17._M_node != local_70) && (layer->_oneof_case_[0] != 600)) {
              pmVar18 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[](local_b8,pkVar6);
              p_Var7 = (pmVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              local_1b0 = (undefined1  [8])local_1a0;
              lVar11 = *(long *)(p_Var7 + 1);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1b0,lVar11,(long)&(p_Var7[1]._M_parent)->_M_color + lVar11)
              ;
              psVar8 = (layer->name_).ptr_;
              local_68[0] = local_58;
              pcVar5 = (psVar8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_68,pcVar5,pcVar5 + psVar8->_M_string_length);
              plVar16 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_68,0,(char *)0x0,0x328d97);
              local_118 = &local_108;
              puVar20 = (ulong *)(plVar16 + 2);
              if ((ulong *)*plVar16 == puVar20) {
                local_108 = *puVar20;
                lStack_100 = plVar16[3];
              }
              else {
                local_108 = *puVar20;
                local_118 = (ulong *)*plVar16;
              }
              local_110 = plVar16[1];
              *plVar16 = (long)puVar20;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_118);
              local_138 = &local_128;
              puVar20 = (ulong *)(plVar16 + 2);
              if ((ulong *)*plVar16 == puVar20) {
                local_128 = *puVar20;
                uStack_120 = (undefined4)plVar16[3];
                uStack_11c = *(undefined4 *)((long)plVar16 + 0x1c);
              }
              else {
                local_128 = *puVar20;
                local_138 = (ulong *)*plVar16;
              }
              local_130 = plVar16[1];
              *plVar16 = (long)puVar20;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              local_a0 = local_90;
              pcVar5 = (pkVar6->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a0,pcVar5,pcVar5 + pkVar6->_M_string_length);
              uVar23 = 0xf;
              if (local_138 != &local_128) {
                uVar23 = local_128;
              }
              if (uVar23 < (ulong)(local_98 + local_130)) {
                uVar23 = 0xf;
                if (local_a0 != local_90) {
                  uVar23 = local_90[0];
                }
                if (uVar23 < (ulong)(local_98 + local_130)) goto LAB_002934e8;
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_a0,0,(char *)0x0,(ulong)local_138);
              }
              else {
LAB_002934e8:
                puVar15 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_a0);
              }
              local_158 = &local_148;
              plVar16 = puVar15 + 2;
              if ((long *)*puVar15 == plVar16) {
                local_148 = *plVar16;
                uStack_140 = puVar15[3];
              }
              else {
                local_148 = *plVar16;
                local_158 = (long *)*puVar15;
              }
              local_150 = puVar15[1];
              *puVar15 = plVar16;
              puVar15[1] = 0;
              *(undefined1 *)plVar16 = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_158);
              local_178 = &local_168;
              puVar20 = (ulong *)(plVar16 + 2);
              if ((ulong *)*plVar16 == puVar20) {
                local_168 = *puVar20;
                lStack_160 = plVar16[3];
              }
              else {
                local_168 = *puVar20;
                local_178 = (ulong *)*plVar16;
              }
              local_170 = plVar16[1];
              *plVar16 = (long)puVar20;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              puVar15 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_1b0);
              local_1d0 = &local_1c0;
              puVar20 = puVar15 + 2;
              if ((ulong *)*puVar15 == puVar20) {
                local_1c0 = *puVar20;
                uStack_1b8 = puVar15[3];
              }
              else {
                local_1c0 = *puVar20;
                local_1d0 = (ulong *)*puVar15;
              }
              local_1c8 = puVar15[1];
              *puVar15 = puVar20;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              psVar19 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar19) {
                local_1f0.field_2._M_allocated_capacity = *psVar19;
                local_1f0.field_2._8_8_ = puVar15[3];
              }
              else {
                local_1f0.field_2._M_allocated_capacity = *psVar19;
                local_1f0._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_1f0._M_string_length = puVar15[1];
              *puVar15 = psVar19;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              if (local_1d0 != &local_1c0) {
                operator_delete(local_1d0,local_1c0 + 1);
              }
              if (local_178 != &local_168) {
                operator_delete(local_178,local_168 + 1);
              }
              if (local_158 != &local_148) {
                operator_delete(local_158,local_148 + 1);
              }
              if (local_a0 != local_90) {
                operator_delete(local_a0,local_90[0] + 1);
              }
              if (local_138 != &local_128) {
                operator_delete(local_138,local_128 + 1);
              }
              if (local_118 != &local_108) {
                operator_delete(local_118,local_108 + 1);
              }
              if (local_68[0] != local_58) {
                operator_delete(local_68[0],local_58[0] + 1);
              }
              Result::Result(local_188,INVALID_MODEL_PARAMETERS,&local_1f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              goto LAB_002937ae;
            }
            this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::operator[](local_b8,pkVar6);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>(this_00,(layer->name_).ptr_);
            lVar21 = lVar21 + 8;
          } while (lVar11 * 8 != lVar21);
        }
      }
      else {
LAB_00292f8b:
        *(size_type **)local_188 = local_f8;
        (local_188->m_message)._M_dataplus._M_p = (pointer)local_c0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p == &local_e0) {
          local_c0->_M_allocated_capacity =
               CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
          *(undefined8 *)((long)local_c0 + 8) = local_e0._8_8_;
        }
        else {
          (local_188->m_message)._M_dataplus._M_p = local_f0._M_p;
          (local_188->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
        }
        (local_188->m_message)._M_string_length = local_e8;
        local_e8 = 0;
        local_e0._M_local_buf[0] = '\0';
        local_f0._M_p = (pointer)&local_e0;
LAB_00292ffc:
        bVar10 = true;
      }
LAB_00293001:
      if (bVar10) goto LAB_002937dd;
      ppvVar22 = local_38 + 1;
    } while (ppvVar22 != local_40);
  }
  Result::Result(local_188);
LAB_002937dd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,
                    CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
  }
  return local_188;
}

Assistant:

Result NeuralNetworkSpecValidator::validateNeuralNetwork(const T& nn) {
    
    Result r;
    
    // Loop over the layers
    // For each layer, validate the following:
    // 1. inputtensor/outputtensor message, rank compatibilty with Model input/output ranks
    // 2. Check rank consistency across the network for all blobs: ranks are not allowed to change for the same blob
    // 3. Call layer specific validation function
    // 4. check that layer's inputs are already present in "availableBlobs" set
    // 5. check that layer's outputs are NOT already present in "availableBlobs" set
    // 6. Add the layer's outputs to the "availableBlobs" set
    for (const auto& layer : nn.layers()) {
        
        if (!r.good()) {
            return r;
        }
        
        // check for inputtensor message valididty
        if (ndArrayInterpretation) {
            if (layer.inputtensor_size() != 0) {
                if (layer.input_size() != layer.inputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s input and inputTensors have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.inputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.input(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.input(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s input '" + std::string(layer.input(idx)) + \
                            "' is also an input to the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.input(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.input(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.input(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.input(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
            if (layer.outputtensor_size() != 0) {
                if (layer.output_size() != layer.outputtensor_size()) {
                    std::string err = "Layer '" + std::string(layer.name()) + "''s output and \"outputTensors\" property have different lengths";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                int idx = 0;
                for (const auto& tensor: layer.outputtensor()) {
                    r = validateTensorMessage(tensor, layer);
                    if (!r.good()) {
                        return r;
                    }
                    if (!(ModelIOBlobNameToRank.find(layer.output(idx)) == ModelIOBlobNameToRank.end())) {
                        if (static_cast<int>(tensor.rank()) != ModelIOBlobNameToRank[layer.output(idx)]) {
                            std::string err = "Layer '" + std::string(layer.name()) + "''s output '" + std::string(layer.input(idx)) + \
                            "' is also an output of the model. However, for this tensor the rank provided in the layer description" + \
                            " does not match the one provided in the model description";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    // verify rank consistency of intermediate blobs:
                    // if a blob is both an input and output to layers, the rank specified at both places must match
                    if (blobNameToRank.find(layer.output(idx)) == blobNameToRank.end()) {
                        blobNameToRank[layer.output(idx)] = (int)tensor.rank();
                    } else {
                        if (blobNameToRank[layer.output(idx)] != (int)tensor.rank()) {
                            std::string err = "Inconsistent rank for the blob named '" + std::string(layer.output(idx)) + "'.";
                            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                        }
                    }
                    idx++;
                }
            }
        } // inputtensor, outputtensor validity end
        
        // First, we check the layer for internal correctness
        // this calls layer wise function
        r = validateLayer(layer);
        
        if (!r.good()) {
            return r;
        }
        
        // Check for topological defects: the layer's input must have been produced by a blob we have
        // already seen.
        for (const auto& input: layer.input()) {
            if (blobs.find(input) == blobs.end()) {
                std::string err = "Layer '" + std::string(layer.name()) + "' consumes an input named '"
                + std::string(input) + "' which is not present in this network.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
        
        // Check for topological defects: check that the same output isn't being produced in two different places.
        // unless its the "copy" layer
        for (const auto& output: layer.output()) {
            if (blobs.find(output) != blobs.end()) {
                if (layer.layer_case() != Specification::NeuralNetworkLayer::LayerCase::kCopy) {
                    std::string layer_name = *(blobs[output].begin());
                    std::string err = "Layer '" + std::string(layer.name()) + "' produces an output named '"
                    + std::string(output) + "' which is also an output produced by the layer '"
                    + layer_name + "'.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
            blobs[output].insert(layer.name());
        }
    } // loop over layers
    
    return Result();
}